

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

char * __thiscall icu_63::Package::allocString(Package *this,UBool in,int32_t length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->inStringTop;
  iVar2 = this->outStringTop;
  iVar3 = iVar2;
  if (in != '\0') {
    iVar3 = iVar1;
  }
  iVar3 = length + iVar3 + 1;
  if (iVar3 < 0x186a1) {
    if (in != '\0') {
      this->inStringTop = iVar3;
      return this->inStrings + iVar1;
    }
    this->outStringTop = iVar3;
    return this->outStrings + iVar2;
  }
  fwrite("icupkg: string storage overflow\n",0x20,1,_stderr);
  exit(0xf);
}

Assistant:

char *
Package::allocString(UBool in, int32_t length) {
    char *p;
    int32_t top;

    if(in) {
        top=inStringTop;
        p=inStrings+top;
    } else {
        top=outStringTop;
        p=outStrings+top;
    }
    top+=length+1;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "icupkg: string storage overflow\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    if(in) {
        inStringTop=top;
    } else {
        outStringTop=top;
    }
    return p;
}